

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O1

void dis_dopp(decoctx *deco,dis_res *dres,uint64_t pos)

{
  easm_insn *peVar1;
  easm_subinsn *peVar2;
  long lVar3;
  long lVar4;
  
  peVar1 = dres->insn;
  if (0 < peVar1->subinsnsnum) {
    lVar4 = 0;
    do {
      peVar2 = peVar1->subinsns[lVar4];
      if (0 < peVar2->prefsnum) {
        lVar3 = 0;
        do {
          dis_pp_expr(deco,dres,peVar2->prefs[lVar3],pos);
          lVar3 = lVar3 + 1;
        } while (lVar3 < peVar2->prefsnum);
      }
      dis_pp_sinsn(deco,dres,peVar2->sinsn,pos);
      lVar4 = lVar4 + 1;
    } while (lVar4 < peVar1->subinsnsnum);
  }
  return;
}

Assistant:

void dis_dopp(struct decoctx *deco, struct dis_res *dres, uint64_t pos) {
	dis_pp_insn(deco, dres, dres->insn, pos);
}